

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summarycalctobin.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  undefined8 extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  char *__end;
  char *pcVar4;
  string local_68;
  _Alloc_hider local_48;
  int in_stack_ffffffffffffffc4;
  char local_38 [16];
  
  iVar2 = -1;
  pcVar4 = "vhS:";
  paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)&optarg;
  while( true ) {
    iVar1 = getopt(argc,argv,"vhS:");
    if (iVar1 != 0x53) break;
    iVar2 = atoi(_optarg);
  }
  if (iVar1 == -1) {
    pcVar4 = local_38;
    local_48._M_p = pcVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"","");
    paVar3 = &local_68.field_2;
    local_68._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"","");
    initstreams((string *)&local_48,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar3) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    if (local_48._M_p != pcVar4) {
      operator_delete(local_48._M_p);
    }
    if (iVar2 != -1) {
      doit(in_stack_ffffffffffffffc4);
      return 0;
    }
  }
  else {
    if (iVar1 == 0x76) {
      main_cold_1();
    }
    main_cold_3();
  }
  main_cold_2();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar3) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if (local_48._M_p != pcVar4) {
    operator_delete(local_48._M_p);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int main(int argc, char* argv[])
{

	int opt;
	int maxsampleindex = -1;
	while ((opt = getopt(argc, argv, (char *) "vhS:")) != -1) {
		switch (opt) {
		case 'S':
			maxsampleindex = atoi(optarg);
			break;

		case 'v':
			fprintf(stderr, "%s : version: %s\n", argv[0], VERSION);
			exit(EXIT_FAILURE);
			break;

		case 'h':
		default:
			help();
			exit(EXIT_FAILURE);
		}
	}
	initstreams();
	if (maxsampleindex == -1) {
		fprintf(stderr, "FATAL: Sample size not supplied - please use -s parameter followed by the sample size\n");
			exit(EXIT_FAILURE);
	}

	doit(maxsampleindex);

	return EXIT_SUCCESS;

}